

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall cnn::Model::project_weights(Model *this,float radius)

{
  undefined1 auVar1 [16];
  pointer ppPVar2;
  pointer ppPVar3;
  long *plVar4;
  undefined1 auVar5 [16];
  ostream *poVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  
  if (project_weights::project_scratch == (float *)0x0) {
    project_weights::project_scratch =
         (float *)cnn_mm_malloc((long)(this->all_params).
                                      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->all_params).
                                      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 1,0x100);
  }
  ppPVar2 = (this->all_params).
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar3 = (this->all_params).
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar9 = 0;
  lVar7 = 0;
  for (lVar8 = 0; (pointer)((long)ppPVar2 + lVar8) != ppPVar3; lVar8 = lVar8 + 8) {
    plVar4 = *(long **)((long)ppPVar2 + lVar9 * 2);
    (**(code **)(*plVar4 + 8))(plVar4,(long)project_weights::project_scratch + lVar9);
    lVar7 = lVar7 + -1;
    lVar9 = lVar9 + 4;
  }
  dVar10 = 0.0;
  for (lVar8 = 0; -lVar8 != lVar7; lVar8 = lVar8 + 1) {
    dVar10 = dVar10 + (double)project_weights::project_scratch[lVar8];
  }
  std::operator<<((ostream *)&std::cerr,"NORM: ");
  auVar1._8_8_ = 0;
  auVar1._0_8_ = dVar10;
  auVar5._8_8_ = in_XMM2_Qb;
  auVar5._0_8_ = in_XMM2_Qa;
  auVar1 = vsqrtsd_avx(auVar5,auVar1);
  poVar6 = std::ostream::_M_insert<double>(auVar1._0_8_);
  std::endl<char,std::char_traits<char>>(poVar6);
  return;
}

Assistant:

void Model::project_weights(float radius) {
  static float* project_scratch = 0;
  if (!project_scratch)
    project_scratch = (float*)cnn_mm_malloc(all_params.size() * sizeof(float), 256);
  int pi = 0;
  for (auto p : all_params) {
    p->squared_l2norm(&project_scratch[pi]);
    ++pi;
  }
  double gg = 0;
  for (int i = 0; i < pi; ++i)
    gg += project_scratch[i];
  cerr << "NORM: " << sqrt(gg) << endl;
}